

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.cpp
# Opt level: O0

void __thiscall aeron::Publication::~Publication(Publication *this)

{
  undefined8 *in_RDI;
  int64_t in_stack_00000048;
  ClientConductor *in_stack_00000050;
  unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  *this_00;
  unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  *local_18;
  
  *in_RDI = &PTR__Publication_0024fc80;
  ClientConductor::releasePublication(in_stack_00000050,in_stack_00000048);
  this_00 = (unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
             *)(in_RDI + 0x14);
  local_18 = (unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
              *)(in_RDI + 0x17);
  do {
    local_18 = local_18 + -1;
    std::
    unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
    ::~unique_ptr(this_00);
  } while (local_18 != this_00);
  std::shared_ptr<aeron::LogBuffers>::~shared_ptr((shared_ptr<aeron::LogBuffers> *)0x212d3f);
  concurrent::status::ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>::
  ~ReadablePosition((ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition> *)0x212d4d);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  return;
}

Assistant:

Publication::~Publication()
{
    m_conductor.releasePublication(m_registrationId);
}